

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

_Bool http_should_fail(Curl_easy *data,int httpcode)

{
  _Bool _Var1;
  
  _Var1 = false;
  if ((399 < httpcode) && ((*(ulong *)&(data->set).field_0x89c & 0x400000) != 0)) {
    if (((data->state).resume_from == 0) || ((httpcode != 0x1a0 || ((data->state).httpreq != '\0')))
       ) {
      _Var1 = true;
      if (httpcode == 0x197) {
        if (((ulong)data->conn->bits & 4) != 0) goto LAB_00134125;
      }
      else if ((httpcode == 0x191) && ((data->state).aptr.user != (char *)0x0)) {
LAB_00134125:
        return (_Bool)((byte)(data->state).field_0x7be >> 7);
      }
    }
    else {
      _Var1 = false;
    }
  }
  return _Var1;
}

Assistant:

static bool http_should_fail(struct Curl_easy *data, int httpcode)
{
  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);

  /*
  ** If we have not been asked to fail on error,
  ** do not fail.
  */
  if(!data->set.http_fail_on_error)
    return FALSE;

  /*
  ** Any code < 400 is never terminal.
  */
  if(httpcode < 400)
    return FALSE;

  /*
  ** A 416 response to a resume request is presumably because the file is
  ** already completely downloaded and thus not actually a fail.
  */
  if(data->state.resume_from && data->state.httpreq == HTTPREQ_GET &&
     httpcode == 416)
    return FALSE;

  /*
  ** Any code >= 400 that is not 401 or 407 is always
  ** a terminal error
  */
  if((httpcode != 401) && (httpcode != 407))
    return TRUE;

  /*
  ** All we have left to deal with is 401 and 407
  */
  DEBUGASSERT((httpcode == 401) || (httpcode == 407));

  /*
  ** Examine the current authentication state to see if this is an error. The
  ** idea is for this function to get called after processing all the headers
  ** in a response message. So, if we have been to asked to authenticate a
  ** particular stage, and we have done it, we are OK. If we are already
  ** completely authenticated, it is not OK to get another 401 or 407.
  **
  ** It is possible for authentication to go stale such that the client needs
  ** to reauthenticate. Once that info is available, use it here.
  */

  /*
  ** Either we are not authenticating, or we are supposed to be authenticating
  ** something else. This is an error.
  */
  if((httpcode == 401) && !data->state.aptr.user)
    return TRUE;
#ifndef CURL_DISABLE_PROXY
  if((httpcode == 407) && !data->conn->bits.proxy_user_passwd)
    return TRUE;
#endif

  return data->state.authproblem;
}